

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

void __thiscall r_code::Code::Code(Code *this)

{
  (this->super__Object).refCount.super___atomic_base<long>._M_i = 0;
  (this->super__Object)._vptr__Object = (_func_int **)&PTR__Code_0011cab0;
  this->storage_index = -1;
  (this->markers).cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->markers).cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->markers).cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)&(this->markers).used_cells_head = 0xffffffff;
  *(undefined4 *)((long)&(this->markers).used_cells_head + 4) = 0xffffffff;
  *(undefined4 *)&(this->markers).used_cells_tail = 0xffffffff;
  *(undefined4 *)((long)&(this->markers).used_cells_tail + 4) = 0xffffffff;
  (this->markers).free_cells = -1;
  (this->markers).used_cell_count = 0;
  (this->markers).free_cell_count = 0;
  (this->views)._M_h._M_buckets = &(this->views)._M_h._M_single_bucket;
  (this->views)._M_h._M_bucket_count = 1;
  (this->views)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->views)._M_h._M_element_count = 0;
  (this->views)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->views)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->views)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  vector<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>::
  reserve(&(this->markers).cells,8);
  return;
}

Assistant:

Code(): storage_index(null_storage_index)
    {
        markers.reserve(CodeMarkersInitialSize);
    }